

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

void gimage::imageSelect<unsigned_short,gimage::PixelTraits<unsigned_short>>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *ret,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int j)

{
  long lVar1;
  long lVar2;
  unsigned_short ***pppuVar3;
  unsigned_short ***pppuVar4;
  unsigned_short *puVar5;
  unsigned_short *puVar6;
  long lVar7;
  long lVar8;
  
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (ret,image->width,image->height,1);
  lVar1 = image->height;
  if (0 < lVar1) {
    lVar2 = image->width;
    pppuVar3 = image->img;
    pppuVar4 = ret->img;
    lVar7 = 0;
    do {
      if (0 < lVar2) {
        puVar5 = pppuVar3[j][lVar7];
        puVar6 = (*pppuVar4)[lVar7];
        lVar8 = 0;
        do {
          puVar6[lVar8] = puVar5[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar2 != lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar1);
  }
  return;
}

Assistant:

void imageSelect(Image<T, traits> &ret, const Image<T, traits> &image, int j)
{
  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, j));
    }
  }
}